

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateFactorDiscrete.cpp
# Opt level: O2

string * __thiscall
StateFactorDiscrete::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,StateFactorDiscrete *this)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  stringstream ss;
  string asStack_1f8 [32];
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"SF \'");
  std::__cxx11::string::string(local_1d8,(string *)&(this->super_NamedDescribedEntity)._m_name);
  poVar2 = std::operator<<(poVar2,local_1d8);
  poVar2 = std::operator<<(poVar2,"\' (");
  std::__cxx11::string::string
            (asStack_1f8,(string *)&(this->super_NamedDescribedEntity)._m_description);
  poVar2 = std::operator<<(poVar2,asStack_1f8);
  std::operator<<(poVar2,"), values: {");
  std::__cxx11::string::~string(asStack_1f8);
  std::__cxx11::string::~string(local_1d8);
  pbVar1 = (this->_m_domainValues).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->_m_domainValues).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    if (pbVar3 != (this->_m_domainValues).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(local_1a8,", ");
    }
    std::operator<<(local_1a8,(string *)pbVar3);
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string StateFactorDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << "SF '"<< GetName() << "' ("<<GetDescription()<<"), values: {";
    vector<string>::const_iterator it = _m_domainValues.begin();
    vector<string>::const_iterator last = _m_domainValues.end();
    while(it != last)
    {
        if(it != _m_domainValues.begin() )
            ss << ", ";
        ss << *it;
        it++;
    }
    ss << "}";
    return(ss.str() );
}